

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_helper.c
# Opt level: O3

int nghttp2_check_header_name(uint8_t *name,size_t len)

{
  int iVar1;
  size_t sVar2;
  
  iVar1 = 0;
  if (len != 0) {
    if (*name == ':') {
      if (len == 1) {
        return 0;
      }
      name = name + 1;
      len = len - 1;
    }
    sVar2 = 0;
    do {
      if (VALID_HD_NAME_CHARS[name[sVar2]] == 0) {
        return 0;
      }
      sVar2 = sVar2 + 1;
    } while (len != sVar2);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int nghttp2_check_header_name(const uint8_t *name, size_t len) {
  const uint8_t *last;
  if (len == 0) {
    return 0;
  }
  if (*name == ':') {
    if (len == 1) {
      return 0;
    }
    ++name;
    --len;
  }
  for (last = name + len; name != last; ++name) {
    if (!VALID_HD_NAME_CHARS[*name]) {
      return 0;
    }
  }
  return 1;
}